

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinylogger.h
# Opt level: O1

string * __thiscall
tlog::durationToString<std::chrono::duration<long,std::ratio<1l,1000000l>>>
          (string *__return_storage_ptr__,tlog *this,duration<long,_std::ratio<1L,_1000000L>_> dur)

{
  bool bVar1;
  ulong __val;
  ulong __val_00;
  uint uVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  size_type *psVar8;
  ulong uVar9;
  string *psVar10;
  long lVar11;
  ulong *puVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  string __str_3;
  string __str_1;
  string __str;
  string __str_4;
  string __str_2;
  ulong *local_250;
  ulong local_248;
  ulong local_240;
  undefined8 uStack_238;
  ulong *local_230;
  ulong local_228;
  ulong local_220;
  long lStack_218;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  ulong *local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  string *local_1b0;
  ulong *local_1a8;
  ulong local_1a0;
  ulong local_198;
  undefined8 uStack_190;
  ulong local_188;
  long local_180;
  ulong *local_178;
  ulong local_170;
  undefined1 local_168;
  undefined7 uStack_167;
  long lStack_160;
  ulong *local_158;
  ulong local_150;
  ulong local_148;
  undefined8 uStack_140;
  ulong *local_138;
  ulong local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  undefined8 uStack_120;
  ulong *local_118;
  ulong local_110;
  undefined1 local_108;
  undefined7 uStack_107;
  undefined8 uStack_100;
  ulong *local_f8;
  ulong local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  long lStack_e0;
  ulong *local_d8;
  ulong local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  undefined8 uStack_c0;
  ulong *local_b8;
  ulong local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  undefined8 uStack_a0;
  ulong *local_98;
  ulong local_90;
  ulong local_88;
  undefined8 uStack_80;
  ulong *local_78;
  ulong local_70;
  ulong local_68;
  undefined8 uStack_60;
  ulong *local_58;
  ulong local_50;
  ulong local_48;
  undefined8 uStack_40;
  long local_38;
  
  uVar7 = (long)this / 86400000000;
  lVar11 = (long)this % 86400000000;
  __val = lVar11 / 3600000000;
  lVar13 = lVar11 % 3600000000;
  __val_00 = lVar13 / 60000000;
  lVar15 = lVar13 % 60000000;
  uVar9 = lVar15 / 1000000;
  local_1b0 = __return_storage_ptr__;
  if ((long)this < 86400000000) {
    if (lVar11 < 3600000000) {
      if (lVar13 < 60000000) {
        uVar7 = -uVar9;
        if (0 < (long)uVar9) {
          uVar7 = uVar9;
        }
        uVar14 = 1;
        if (9 < uVar7) {
          uVar9 = uVar7;
          uVar2 = 4;
          do {
            uVar14 = uVar2;
            if (uVar9 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_0010690f;
            }
            if (uVar9 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_0010690f;
            }
            if (uVar9 < 10000) goto LAB_0010690f;
            bVar1 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            uVar2 = uVar14 + 4;
          } while (bVar1);
          uVar14 = uVar14 + 1;
        }
LAB_0010690f:
        puVar5 = &local_240;
        local_250 = puVar5;
        std::__cxx11::string::_M_construct((ulong)&local_250,(lVar15 < -999999) + (char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((long)local_250 + (ulong)(lVar15 < -999999)),uVar14,uVar7);
        plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_250,local_248,0,'\x01');
        (local_1b0->_M_dataplus)._M_p = (pointer)&local_1b0->field_2;
        psVar8 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar8) {
          lVar11 = plVar3[3];
          (local_1b0->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&local_1b0->field_2 + 8) = lVar11;
        }
        else {
          (local_1b0->_M_dataplus)._M_p = (pointer)*plVar3;
          (local_1b0->field_2)._M_allocated_capacity = *psVar8;
        }
        local_1b0->_M_string_length = plVar3[1];
        *plVar3 = (long)psVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        psVar10 = local_1b0;
        puVar12 = local_250;
      }
      else {
        uVar14 = 1;
        if (9 < __val_00) {
          uVar7 = __val_00;
          uVar2 = 4;
          do {
            uVar14 = uVar2;
            if (uVar7 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_0010680d;
            }
            if (uVar7 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_0010680d;
            }
            if (uVar7 < 10000) goto LAB_0010680d;
            bVar1 = 99999 < uVar7;
            uVar7 = uVar7 / 10000;
            uVar2 = uVar14 + 4;
          } while (bVar1);
          uVar14 = uVar14 + 1;
        }
LAB_0010680d:
        puVar5 = &local_1e0;
        local_1f0 = puVar5;
        std::__cxx11::string::_M_construct((ulong)&local_1f0,(char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1f0,uVar14,__val_00);
        puVar4 = (undefined8 *)
                 std::__cxx11::string::_M_replace_aux((ulong)&local_1f0,local_1e8,0,'\x01');
        puVar12 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar12) {
          local_200 = *puVar12;
          lStack_1f8 = puVar4[3];
          local_210 = &local_200;
        }
        else {
          local_200 = *puVar12;
          local_210 = (ulong *)*puVar4;
        }
        local_208 = puVar4[1];
        *puVar4 = puVar12;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        uVar7 = -uVar9;
        if (0 < (long)uVar9) {
          uVar7 = uVar9;
        }
        uVar14 = 1;
        if (9 < uVar7) {
          uVar9 = uVar7;
          uVar2 = 4;
          do {
            uVar14 = uVar2;
            if (uVar9 < 100) {
              uVar14 = uVar14 - 2;
              goto LAB_001069b9;
            }
            if (uVar9 < 1000) {
              uVar14 = uVar14 - 1;
              goto LAB_001069b9;
            }
            if (uVar9 < 10000) goto LAB_001069b9;
            bVar1 = 99999 < uVar9;
            uVar9 = uVar9 / 10000;
            uVar2 = uVar14 + 4;
          } while (bVar1);
          uVar14 = uVar14 + 1;
        }
LAB_001069b9:
        local_f8 = (ulong *)&local_e8;
        std::__cxx11::string::_M_construct((ulong)&local_f8,(lVar15 < -999999) + (char)uVar14);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  ((char *)((ulong)(lVar15 < -999999) + (long)local_f8),uVar14,uVar7);
        if (local_f0 < 2) {
          std::__cxx11::string::insert((ulong)&local_f8,0,'\x02' - (char)local_f0);
        }
        uVar9 = local_f0;
        psVar10 = local_1b0;
        if (local_f8 == (ulong *)&local_e8) {
          lStack_218 = lStack_e0;
          local_230 = &local_220;
        }
        else {
          local_230 = local_f8;
        }
        local_220 = CONCAT71(uStack_e7,local_e8);
        local_228 = local_f0;
        local_f0 = 0;
        local_e8 = 0;
        uVar7 = 0xf;
        if (local_210 != &local_200) {
          uVar7 = local_200;
        }
        if (uVar7 < local_208 + uVar9) {
          uVar7 = 0xf;
          if (local_230 != &local_220) {
            uVar7 = local_220;
          }
          if (uVar7 < local_208 + uVar9) goto LAB_00106ad0;
          local_f8 = (ulong *)&local_e8;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_230,0,(char *)0x0,(ulong)local_210);
        }
        else {
LAB_00106ad0:
          local_f8 = (ulong *)&local_e8;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_230);
        }
        local_250 = &local_240;
        puVar12 = puVar4 + 2;
        if ((ulong *)*puVar4 == puVar12) {
          local_240 = *puVar12;
          uStack_238 = puVar4[3];
        }
        else {
          local_240 = *puVar12;
          local_250 = (ulong *)*puVar4;
        }
        local_248 = puVar4[1];
        *puVar4 = puVar12;
        puVar4[1] = 0;
        *(undefined1 *)puVar12 = 0;
        plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_250,local_248,0,'\x01');
        (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
        psVar8 = (size_type *)(plVar3 + 2);
        if ((size_type *)*plVar3 == psVar8) {
          lVar11 = plVar3[3];
          (psVar10->field_2)._M_allocated_capacity = *psVar8;
          *(long *)((long)&psVar10->field_2 + 8) = lVar11;
        }
        else {
          (psVar10->_M_dataplus)._M_p = (pointer)*plVar3;
          (psVar10->field_2)._M_allocated_capacity = *psVar8;
        }
        psVar10->_M_string_length = plVar3[1];
        *plVar3 = (long)psVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_250 != &local_240) {
          operator_delete(local_250);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230);
        }
        if (local_f8 != (ulong *)&local_e8) {
          operator_delete(local_f8);
        }
        puVar12 = local_1f0;
        if (local_210 != &local_200) {
          operator_delete(local_210);
          puVar12 = local_1f0;
        }
      }
      if (puVar12 == puVar5) {
        return psVar10;
      }
      goto LAB_001067e4;
    }
    uVar14 = 1;
    if (9 < __val) {
      uVar7 = __val;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001061ec;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001061ec;
        }
        if (uVar7 < 10000) goto LAB_001061ec;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_001061ec:
    local_1a8 = &local_198;
    local_188 = uVar9;
    local_180 = lVar13;
    std::__cxx11::string::_M_construct((ulong)&local_1a8,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1a8,uVar14,__val);
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_replace_aux((ulong)&local_1a8,local_1a0,0,'\x01');
    lVar11 = local_180;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_220 = *puVar5;
      lStack_218 = puVar4[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar5;
      local_230 = (ulong *)*puVar4;
    }
    local_228 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    uVar9 = -__val_00;
    if (0 < (long)__val_00) {
      uVar9 = __val_00;
    }
    uVar14 = 1;
    if (9 < uVar9) {
      uVar7 = uVar9;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001062e6;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001062e6;
        }
        if (uVar7 < 10000) goto LAB_001062e6;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_001062e6:
    local_178 = (ulong *)&local_168;
    std::__cxx11::string::_M_construct((ulong)&local_178,(local_180 < -59999999) + (char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((ulong)(lVar11 < -59999999) + (long)local_178),uVar14,uVar9);
    if (local_170 < 2) {
      std::__cxx11::string::insert((ulong)&local_178,0,'\x02' - (char)local_170);
    }
    uVar9 = local_170;
    if (local_178 == (ulong *)&local_168) {
      lStack_1b8 = lStack_160;
      local_1d0 = &local_1c0;
    }
    else {
      local_1d0 = local_178;
    }
    local_1c0 = CONCAT71(uStack_167,local_168);
    local_1c8 = local_170;
    local_170 = 0;
    local_168 = 0;
    uVar7 = 0xf;
    if (local_230 != &local_220) {
      uVar7 = local_220;
    }
    local_178 = (ulong *)&local_168;
    if (uVar7 < local_228 + uVar9) {
      uVar7 = 0xf;
      if (local_1d0 != &local_1c0) {
        uVar7 = local_1c0;
      }
      if (uVar7 < local_228 + uVar9) goto LAB_00106411;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_230);
    }
    else {
LAB_00106411:
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1d0);
    }
    local_1f0 = &local_1e0;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_1e0 = *puVar5;
      uStack_1d8 = puVar4[3];
    }
    else {
      local_1e0 = *puVar5;
      local_1f0 = (ulong *)*puVar4;
    }
    local_1e8 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_replace_aux((ulong)&local_1f0,local_1e8,0,'\x01');
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_200 = *puVar5;
      lStack_1f8 = puVar4[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar5;
      local_210 = (ulong *)*puVar4;
    }
    local_208 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    uVar9 = -local_188;
    if (0 < (long)local_188) {
      uVar9 = local_188;
    }
    uVar14 = 1;
    if (9 < uVar9) {
      uVar7 = uVar9;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0010654d;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0010654d;
        }
        if (uVar7 < 10000) goto LAB_0010654d;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_0010654d:
    local_d8 = (ulong *)&local_c8;
    std::__cxx11::string::_M_construct((ulong)&local_d8,(lVar15 < -999999) + (char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((long)local_d8 + (ulong)(lVar15 < -999999)),uVar14,uVar9);
    if (local_d0 < 2) {
      std::__cxx11::string::insert((ulong)&local_d8,0,'\x02' - (char)local_d0);
    }
    uVar9 = local_d0;
    psVar10 = local_1b0;
    if (local_d8 == (ulong *)&local_c8) {
      uStack_140 = uStack_c0;
      local_158 = &local_148;
    }
    else {
      local_158 = local_d8;
    }
    local_148 = CONCAT71(uStack_c7,local_c8);
    local_150 = local_d0;
    local_d0 = 0;
    local_c8 = 0;
    uVar7 = 0xf;
    if (local_210 != &local_200) {
      uVar7 = local_200;
    }
    if (uVar7 < local_208 + uVar9) {
      uVar7 = 0xf;
      if (local_158 != &local_148) {
        uVar7 = local_148;
      }
      if (uVar7 < local_208 + uVar9) goto LAB_00106675;
      local_d8 = (ulong *)&local_c8;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_00106675:
      local_d8 = (ulong *)&local_c8;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_158);
    }
    local_250 = &local_240;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_240 = *puVar5;
      uStack_238 = puVar4[3];
    }
    else {
      local_240 = *puVar5;
      local_250 = (ulong *)*puVar4;
    }
    local_248 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_250,local_248,0,'\x01');
    (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar8) {
      lVar11 = plVar3[3];
      (psVar10->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&psVar10->field_2 + 8) = lVar11;
    }
    else {
      (psVar10->_M_dataplus)._M_p = (pointer)*plVar3;
      (psVar10->field_2)._M_allocated_capacity = *psVar8;
    }
    psVar10->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    if (local_158 != &local_148) {
      operator_delete(local_158);
    }
    if (local_d8 != (ulong *)&local_c8) {
      operator_delete(local_d8);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    if (local_178 != (ulong *)&local_168) {
      operator_delete(local_178);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    puVar5 = &local_198;
    puVar12 = local_1a8;
  }
  else {
    uVar14 = 1;
    if (9 < uVar7) {
      uVar6 = uVar7;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar6 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_001058f5;
        }
        if (uVar6 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_001058f5;
        }
        if (uVar6 < 10000) goto LAB_001058f5;
        bVar1 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_001058f5:
    local_158 = &local_148;
    local_188 = uVar9;
    local_180 = lVar13;
    local_38 = lVar15;
    std::__cxx11::string::_M_construct((ulong)&local_158,(char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long_long>((char *)local_158,uVar14,uVar7);
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_158,local_150,0,'\x01');
    local_1d0 = &local_1c0;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_1c0 = *puVar5;
      lStack_1b8 = plVar3[3];
    }
    else {
      local_1c0 = *puVar5;
      local_1d0 = (ulong *)*plVar3;
    }
    local_1c8 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar9 = -__val;
    if (0 < (long)__val) {
      uVar9 = __val;
    }
    uVar14 = 1;
    if (9 < uVar9) {
      uVar7 = uVar9;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00105a0d;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00105a0d;
        }
        if (uVar7 < 10000) goto LAB_00105a0d;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_00105a0d:
    local_118 = (ulong *)&local_108;
    std::__cxx11::string::_M_construct((ulong)&local_118,(lVar11 < -3599999999) + (char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((ulong)(lVar11 < -3599999999) + (long)local_118),uVar14,uVar9);
    if (local_110 < 2) {
      std::__cxx11::string::insert((ulong)&local_118,0,'\x02' - (char)local_110);
    }
    uVar9 = local_110;
    lVar11 = local_180;
    if (local_118 == (ulong *)&local_108) {
      uStack_60 = uStack_100;
      local_78 = &local_68;
    }
    else {
      local_78 = local_118;
    }
    local_68 = CONCAT71(uStack_107,local_108);
    local_70 = local_110;
    local_110 = 0;
    local_108 = 0;
    uVar7 = 0xf;
    if (local_1d0 != &local_1c0) {
      uVar7 = local_1c0;
    }
    if (uVar7 < local_1c8 + uVar9) {
      uVar7 = 0xf;
      if (local_78 != &local_68) {
        uVar7 = local_68;
      }
      if (uVar7 < local_1c8 + uVar9) goto LAB_00105b42;
      local_118 = (ulong *)&local_108;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,(ulong)local_1d0);
    }
    else {
LAB_00105b42:
      local_118 = (ulong *)&local_108;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_78);
    }
    local_1a8 = &local_198;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_198 = *puVar5;
      uStack_190 = puVar4[3];
    }
    else {
      local_198 = *puVar5;
      local_1a8 = (ulong *)*puVar4;
    }
    local_1a0 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1a8,local_1a0,0,'\x01');
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_220 = *puVar5;
      lStack_218 = plVar3[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar5;
      local_230 = (ulong *)*plVar3;
    }
    local_228 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar9 = -__val_00;
    if (0 < (long)__val_00) {
      uVar9 = __val_00;
    }
    uVar14 = 1;
    if (9 < uVar9) {
      uVar7 = uVar9;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00105c87;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00105c87;
        }
        if (uVar7 < 10000) goto LAB_00105c87;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_00105c87:
    local_138 = (ulong *)&local_128;
    std::__cxx11::string::_M_construct((ulong)&local_138,(lVar11 < -59999999) + (char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((ulong)(lVar11 < -59999999) + (long)local_138),uVar14,uVar9);
    if (local_130 < 2) {
      std::__cxx11::string::insert((ulong)&local_138,0,'\x02' - (char)local_130);
    }
    uVar9 = local_130;
    if (local_138 == (ulong *)&local_128) {
      uStack_80 = uStack_120;
      local_98 = &local_88;
    }
    else {
      local_98 = local_138;
    }
    local_88 = CONCAT71(uStack_127,local_128);
    local_90 = local_130;
    local_130 = 0;
    local_128 = 0;
    uVar7 = 0xf;
    if (local_230 != &local_220) {
      uVar7 = local_220;
    }
    if (uVar7 < local_228 + uVar9) {
      uVar7 = 0xf;
      if (local_98 != &local_88) {
        uVar7 = local_88;
      }
      if (uVar7 < local_228 + uVar9) goto LAB_00105da1;
      local_138 = (ulong *)&local_128;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_230);
    }
    else {
LAB_00105da1:
      local_138 = (ulong *)&local_128;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_98);
    }
    local_1f0 = &local_1e0;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_1e0 = *puVar5;
      uStack_1d8 = puVar4[3];
    }
    else {
      local_1e0 = *puVar5;
      local_1f0 = (ulong *)*puVar4;
    }
    local_1e8 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_1f0,local_1e8,0,'\x01');
    lVar11 = local_38;
    puVar5 = (ulong *)(plVar3 + 2);
    if ((ulong *)*plVar3 == puVar5) {
      local_200 = *puVar5;
      lStack_1f8 = plVar3[3];
      local_210 = &local_200;
    }
    else {
      local_200 = *puVar5;
      local_210 = (ulong *)*plVar3;
    }
    local_208 = plVar3[1];
    *plVar3 = (long)puVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    uVar9 = -local_188;
    if (0 < (long)local_188) {
      uVar9 = local_188;
    }
    uVar14 = 1;
    if (9 < uVar9) {
      uVar7 = uVar9;
      uVar2 = 4;
      do {
        uVar14 = uVar2;
        if (uVar7 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_00105eda;
        }
        if (uVar7 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_00105eda;
        }
        if (uVar7 < 10000) goto LAB_00105eda;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        uVar2 = uVar14 + 4;
      } while (bVar1);
      uVar14 = uVar14 + 1;
    }
LAB_00105eda:
    local_b8 = (ulong *)&local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(local_38 < -999999) + (char)uVar14);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)((ulong)(lVar11 < -999999) + (long)local_b8),uVar14,uVar9);
    if (local_b0 < 2) {
      std::__cxx11::string::insert((ulong)&local_b8,0,'\x02' - (char)local_b0);
    }
    uVar9 = local_b0;
    psVar10 = local_1b0;
    if (local_b8 == (ulong *)&local_a8) {
      uStack_40 = uStack_a0;
      local_58 = &local_48;
    }
    else {
      local_58 = local_b8;
    }
    local_48 = CONCAT71(uStack_a7,local_a8);
    local_50 = local_b0;
    local_b0 = 0;
    local_a8 = 0;
    uVar7 = 0xf;
    if (local_210 != &local_200) {
      uVar7 = local_200;
    }
    if (uVar7 < local_208 + uVar9) {
      uVar7 = 0xf;
      if (local_58 != &local_48) {
        uVar7 = local_48;
      }
      if (uVar7 < local_208 + uVar9) goto LAB_0010600a;
      local_b8 = (ulong *)&local_a8;
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_210);
    }
    else {
LAB_0010600a:
      local_b8 = (ulong *)&local_a8;
      puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_58);
    }
    local_250 = &local_240;
    puVar5 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar5) {
      local_240 = *puVar5;
      uStack_238 = puVar4[3];
    }
    else {
      local_240 = *puVar5;
      local_250 = (ulong *)*puVar4;
    }
    local_248 = puVar4[1];
    *puVar4 = puVar5;
    puVar4[1] = 0;
    *(undefined1 *)puVar5 = 0;
    plVar3 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_250,local_248,0,'\x01');
    (psVar10->_M_dataplus)._M_p = (pointer)&psVar10->field_2;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((size_type *)*plVar3 == psVar8) {
      lVar11 = plVar3[3];
      (psVar10->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&psVar10->field_2 + 8) = lVar11;
    }
    else {
      (psVar10->_M_dataplus)._M_p = (pointer)*plVar3;
      (psVar10->field_2)._M_allocated_capacity = *psVar8;
    }
    psVar10->_M_string_length = plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    if (local_250 != &local_240) {
      operator_delete(local_250);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
    if (local_b8 != (ulong *)&local_a8) {
      operator_delete(local_b8);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98);
    }
    if (local_138 != (ulong *)&local_128) {
      operator_delete(local_138);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_1a8 != &local_198) {
      operator_delete(local_1a8);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if (local_118 != (ulong *)&local_108) {
      operator_delete(local_118);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    puVar5 = &local_148;
    puVar12 = local_158;
  }
  if (puVar12 == puVar5) {
    return psVar10;
  }
LAB_001067e4:
  operator_delete(puVar12);
  return psVar10;
}

Assistant:

std::string durationToString(T dur) {
        using namespace std::chrono;
        using day_t = duration<long long, std::ratio<3600 * 24>>;

        auto d = duration_cast<day_t>(dur);
        auto h = duration_cast<hours>(dur -= d);
        auto m = duration_cast<minutes>(dur -= h);
        auto s = duration_cast<seconds>(dur -= m);

        if (d.count() > 0) {
            return
                std::to_string(d.count()) + 'd' +
                padFromLeft(std::to_string(h.count()), 2, '0') + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (h.count() > 0) {
            return
                std::to_string(h.count()) + 'h' +
                padFromLeft(std::to_string(m.count()), 2, '0') + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else if (m.count() > 0) {
            return
                std::to_string(m.count()) + 'm' +
                padFromLeft(std::to_string(s.count()), 2, '0') + 's';
        } else {
            return std::to_string(s.count()) + 's';
        }
    }